

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apinames.cpp
# Opt level: O1

int test_c(void)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  RtMidiApi RVar4;
  char *pcVar5;
  ostream *poVar6;
  size_t sVar7;
  ulong __n;
  ulong uVar8;
  ulong uVar9;
  string name;
  string displayName;
  vector<RtMidiApi,_std::allocator<RtMidiApi>_> apis;
  long *local_90;
  ulong local_88;
  long local_80 [2];
  allocator<char> local_69;
  long *local_68;
  long local_60;
  long local_58 [2];
  vector<RtMidiApi,_std::allocator<RtMidiApi>_> local_48;
  
  uVar2 = rtmidi_get_compiled_api(0,0);
  __n = (ulong)uVar2;
  std::vector<RtMidiApi,_std::allocator<RtMidiApi>_>::vector
            (&local_48,__n,(allocator_type *)&local_90);
  rtmidi_get_compiled_api
            (local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
             super__Vector_impl_data._M_start,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"API names by identifier (C):\n",0x1d);
  if (__n != 0) {
    uVar8 = 0;
    do {
      pcVar5 = (char *)rtmidi_api_name(local_48.
                                       super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar8]);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar5,(allocator<char> *)&local_68);
      if (local_88 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid name for API ",0x15);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar8]);
        std::operator<<(poVar6,"\n");
        goto LAB_00102e43;
      }
      pcVar5 = (char *)rtmidi_api_display_name
                                 (local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar8]);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar5,&local_69);
      if (local_60 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Invalid display name for API ",0x1d);
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar8]);
        std::operator<<(poVar6,"\n");
        goto LAB_00102e43;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* ",2);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," \'",2);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_90,local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\': \'",4);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      uVar8 = uVar8 + 1;
    } while (__n != uVar8);
  }
  pcVar5 = (char *)rtmidi_api_name(0xffffffff);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "";
  }
  local_90 = local_80;
  sVar7 = strlen(pcVar5);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar5,pcVar5 + sVar7);
  if (local_88 == 0) {
    pcVar5 = (char *)rtmidi_api_display_name(0xffffffff);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    local_68 = local_58;
    sVar7 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar5,pcVar5 + sVar7);
    iVar3 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar3 == 0) {
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"API identifiers by name (C):\n",0x1d);
      if (__n != 0) {
        uVar8 = 0;
        do {
          pcVar5 = (char *)rtmidi_api_name(local_48.
                                           super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar8]);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "";
          }
          local_90 = local_80;
          sVar7 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar5,pcVar5 + sVar7)
          ;
          RVar4 = rtmidi_compiled_api_by_name(local_90);
          if (RVar4 != local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8]) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Bad identifier for API \'",0x18);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_90,local_88);
            std::operator<<(poVar6,"\'\n");
            goto LAB_00102e43;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* \'",3);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_90,local_88);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\': ",3);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,local_48.
                                     super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if (local_88 != 0) {
            uVar9 = 0;
            do {
              if ((uVar9 & 1) == 0) {
                iVar3 = tolower((int)*(char *)((long)local_90 + uVar9));
                uVar1 = (undefined1)iVar3;
              }
              else {
                iVar3 = toupper((int)*(char *)((long)local_90 + uVar9));
                uVar1 = (undefined1)iVar3;
              }
              *(undefined1 *)((long)local_90 + uVar9) = uVar1;
              uVar9 = uVar9 + 1;
            } while (uVar9 < local_88);
          }
          iVar3 = rtmidi_compiled_api_by_name(local_90);
          if (iVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Identifier ",0xb);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," for invalid API \'",0x12);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(char *)local_90,local_88);
            std::operator<<(poVar6,"\'\n");
            goto LAB_00102e43;
          }
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != __n);
      }
      iVar3 = rtmidi_compiled_api_by_name("");
      if (iVar3 == 0) {
        if (local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<RtMidiApi,_std::allocator<RtMidiApi>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return 0;
      }
      std::operator<<((ostream *)&std::cout,"Bad identifier for unknown API name\n");
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Bad display string for invalid API \'",0x24);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_68,local_60);
      std::operator<<(poVar6,"\'\n");
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Bad string for invalid API \'",0x1c);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,local_88);
    std::operator<<(poVar6,"\'\n");
  }
LAB_00102e43:
  exit(1);
}

Assistant:

int test_c() {
    unsigned api_count = rtmidi_get_compiled_api(NULL, 0);
    std::vector<RtMidiApi> apis(api_count);
    rtmidi_get_compiled_api(apis.data(), api_count);

    // ensure the known APIs return valid names
    std::cout << "API names by identifier (C):\n";
    for ( size_t i = 0; i < api_count; ++i) {
        const std::string name = rtmidi_api_name(apis[i]);
        if (name.empty()) {
            std::cout << "Invalid name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        const std::string displayName = rtmidi_api_display_name(apis[i]);
        if (displayName.empty()) {
            std::cout << "Invalid display name for API " << (int)apis[i] << "\n";
            exit(1);
        }
        std::cout << "* " << (int)apis[i] << " '" << name << "': '" << displayName << "'\n";
    }

    // ensure unknown APIs return the empty string
    {
        const char *s = rtmidi_api_name((RtMidiApi)-1);
        const std::string name(s?s:"");
        if (!name.empty()) {
            std::cout << "Bad string for invalid API '" << name << "'\n";
            exit(1);
        }
        s = rtmidi_api_display_name((RtMidiApi)-1);
        const std::string displayName(s?s:"");
        if (displayName!="Unknown") {
            std::cout << "Bad display string for invalid API '" << displayName << "'\n";
            exit(1);
        }
    }

    // try getting API identifier by name
    std::cout << "API identifiers by name (C):\n";
    for ( size_t i = 0; i < api_count ; ++i ) {
        const char *s = rtmidi_api_name(apis[i]);
        std::string name(s?s:"");
        if ( rtmidi_compiled_api_by_name(name.c_str()) != apis[i] ) {
            std::cout << "Bad identifier for API '" << name << "'\n";
            exit( 1 );
        }
        std::cout << "* '" << name << "': " << (int)apis[i] << "\n";

        for ( size_t j = 0; j < name.size(); ++j )
            name[j] = (j & 1) ? toupper(name[j]) : tolower(name[j]);
        RtMidiApi api = rtmidi_compiled_api_by_name(name.c_str());
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Identifier " << (int)api << " for invalid API '" << name << "'\n";
            exit( 1 );
        }
    }

    // try getting an API identifier by unknown name
    {
        RtMidiApi api;
        api = rtmidi_compiled_api_by_name("");
        if ( api != RTMIDI_API_UNSPECIFIED ) {
            std::cout << "Bad identifier for unknown API name\n";
            exit( 1 );
        }
    }

    return 0;
}